

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

void __thiscall midi_container::trim_start(midi_container *this)

{
  size_type sVar1;
  unsigned_long j;
  unsigned_long i;
  midi_container *this_local;
  
  if (this->m_form == 2) {
    j = 0;
    sVar1 = std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks);
    for (; j < sVar1; j = j + 1) {
      trim_range_of_tracks(this,j,j);
    }
  }
  else {
    sVar1 = std::vector<midi_track,_std::allocator<midi_track>_>::size(&this->m_tracks);
    trim_range_of_tracks(this,0,sVar1 - 1);
  }
  return;
}

Assistant:

void midi_container::trim_start()
{
    if (m_form == 2)
    {
        for (unsigned long i = 0, j = m_tracks.size(); i < j; ++i)
        {
            trim_range_of_tracks(i, i);
        }
    }
    else
    {
        trim_range_of_tracks(0, m_tracks.size() - 1);
    }
}